

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

void cram_free_container(cram_container *c)

{
  kh_s_i2i_t *__ptr;
  int iVar1;
  cram_slice **__ptr_00;
  long lVar2;
  
  if (c != (cram_container *)0x0) {
    if (c->refs_used != (int *)0x0) {
      free(c->refs_used);
    }
    if (c->landmark != (int32_t *)0x0) {
      free(c->landmark);
    }
    if (c->comp_hdr != (cram_block_compression_hdr *)0x0) {
      cram_free_compression_header(c->comp_hdr);
    }
    if (c->comp_hdr_block != (cram_block *)0x0) {
      cram_free_block(c->comp_hdr_block);
    }
    __ptr_00 = c->slices;
    if (__ptr_00 != (cram_slice **)0x0) {
      iVar1 = c->max_slice;
      if (0 < iVar1) {
        lVar2 = 0;
        do {
          if (c->slices[lVar2] != (cram_slice *)0x0) {
            cram_free_slice(c->slices[lVar2]);
            iVar1 = c->max_slice;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < iVar1);
        __ptr_00 = c->slices;
      }
      free(__ptr_00);
    }
    lVar2 = 0x23;
    do {
      if (*(cram_stats **)(&c->length + lVar2 * 2) != (cram_stats *)0x0) {
        cram_stats_free(*(cram_stats **)(&c->length + lVar2 * 2));
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x3f);
    __ptr = c->tags_used;
    if (__ptr != (kh_s_i2i_t *)0x0) {
      free(__ptr->keys);
      free(__ptr->flags);
      free(__ptr->vals);
      free(__ptr);
    }
    free(c);
    return;
  }
  return;
}

Assistant:

void cram_free_container(cram_container *c) {
    enum cram_DS_ID id;
    int i;

    if (!c)
	return;

    if (c->refs_used)
	free(c->refs_used);

    if (c->landmark)
	free(c->landmark);

    if (c->comp_hdr)
	cram_free_compression_header(c->comp_hdr);

    if (c->comp_hdr_block)
	cram_free_block(c->comp_hdr_block);

    if (c->slices) {
	for (i = 0; i < c->max_slice; i++)
	    if (c->slices[i])
		cram_free_slice(c->slices[i]);
	free(c->slices);
    }

    for (id = DS_RN; id < DS_TN; id++)
	if (c->stats[id]) cram_stats_free(c->stats[id]);

    //if (c->aux_B_stats) cram_stats_free(c->aux_B_stats);
    
    if (c->tags_used) kh_destroy(s_i2i, c->tags_used);

    free(c);
}